

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lowmc.c
# Opt level: O0

void lowmc_compute_aux(lowmc_parameters_t *lowmc,lowmc_key_t *key,randomTape_t *tapes)

{
  uint32_t uVar1;
  lowmc_parameters_t *in_RDI;
  uint32_t lowmc_id;
  randomTape_t *in_stack_00000050;
  lowmc_key_t *in_stack_00000058;
  
  uVar1 = lowmc_get_id(in_RDI);
  if (((DAT_001aa08c & 0x400) == 0x400) && ((DAT_001aa08c & 0x20000) == 0x20000)) {
    if (uVar1 == 0x81002b) {
      lowmc_aux_s256_lowmc_129_129_4(in_stack_00000058,in_stack_00000050);
      return;
    }
    if (uVar1 == 0xc00040) {
      lowmc_aux_s256_lowmc_192_192_4(in_stack_00000058,in_stack_00000050);
      return;
    }
    if (uVar1 == 0xff0055) {
      lowmc_aux_s256_lowmc_255_255_4(in_stack_00000058,in_stack_00000050);
      return;
    }
  }
  if (uVar1 == 0x81002b) {
    lowmc_aux_s128_lowmc_129_129_4(in_stack_00000058,in_stack_00000050);
  }
  else if (uVar1 == 0xc00040) {
    lowmc_aux_s128_lowmc_192_192_4(in_stack_00000058,in_stack_00000050);
  }
  else {
    lowmc_aux_s128_lowmc_255_255_4(in_stack_00000058,in_stack_00000050);
  }
  return;
}

Assistant:

void lowmc_compute_aux(const lowmc_parameters_t* lowmc, lowmc_key_t* key, randomTape_t* tapes) {
  const uint32_t lowmc_id = lowmc_get_id(lowmc);
#if defined(WITH_OPT)
#if defined(WITH_AVX2)
  /* AVX2 enabled instances */
  if (CPU_SUPPORTS_AVX2) {
    switch (lowmc_id) {
      /* Instances with full Sbox layer */
#if defined(WITH_LOWMC_129_129_4)
    case LOWMC_ID(129, 43):
      lowmc_aux_s256_lowmc_129_129_4(key, tapes);
      return;
#endif
#if defined(WITH_LOWMC_192_192_4)
    case LOWMC_ID(192, 64):
      lowmc_aux_s256_lowmc_192_192_4(key, tapes);
      return;
#endif
#if defined(WITH_LOWMC_255_255_4)
    case LOWMC_ID(255, 85):
      lowmc_aux_s256_lowmc_255_255_4(key, tapes);
      return;
#endif
    }
  }
#endif

#if defined(WITH_SSE2) || defined(WITH_NEON)
  /* SSE2/NEON enabled instances */
  if (CPU_SUPPORTS_SSE2 || CPU_SUPPORTS_NEON) {
    switch (lowmc_id) {
      /* Instances with full Sbox layer */
#if defined(WITH_LOWMC_129_129_4)
    case LOWMC_ID(129, 43):
      lowmc_aux_s128_lowmc_129_129_4(key, tapes);
      return;
#endif
#if defined(WITH_LOWMC_192_192_4)
    case LOWMC_ID(192, 64):
      lowmc_aux_s128_lowmc_192_192_4(key, tapes);
      return;
#endif
#if defined(WITH_LOWMC_255_255_4)
    case LOWMC_ID(255, 85):
      lowmc_aux_s128_lowmc_255_255_4(key, tapes);
      return;
#endif
    }
  }
#endif
#endif

#if !defined(NO_UINT64_FALLBACK)
  /* uint64_t implementations */
  switch (lowmc_id) {
    /* Instances with full Sbox layer */
#if defined(WITH_LOWMC_129_129_4)
  case LOWMC_ID(129, 43):
    lowmc_aux_uint64_lowmc_129_129_4(key, tapes);
    return;
#endif
#if defined(WITH_LOWMC_192_192_4)
  case LOWMC_ID(192, 64):
    lowmc_aux_uint64_lowmc_192_192_4(key, tapes);
    return;
#endif
#if defined(WITH_LOWMC_255_255_4)
  case LOWMC_ID(255, 85):
    lowmc_aux_uint64_lowmc_255_255_4(key, tapes);
    return;
#endif
  }
#endif

  UNREACHABLE;
}